

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson(string *str)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RSI;
  string *in_RDI;
  char ch;
  size_t i;
  Message m;
  uchar in_stack_0000015f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  Message *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  string local_58 [8];
  Message *in_stack_ffffffffffffffb0;
  ulong local_20;
  
  Message::Message(in_stack_ffffffffffffffb0);
  for (local_20 = 0; uVar1 = std::__cxx11::string::size(), local_20 < uVar1; local_20 = local_20 + 1
      ) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RSI);
    in_stack_ffffffffffffff8c = (int)*pcVar2;
    if (in_stack_ffffffffffffff8c == 8) {
      Message::operator<<(in_stack_ffffffffffffff80,(char (*) [3])in_stack_ffffffffffffff78);
    }
    else if (in_stack_ffffffffffffff8c == 9) {
      Message::operator<<(in_stack_ffffffffffffff80,(char (*) [3])in_stack_ffffffffffffff78);
    }
    else if (in_stack_ffffffffffffff8c == 10) {
      Message::operator<<(in_stack_ffffffffffffff80,(char (*) [3])in_stack_ffffffffffffff78);
    }
    else if (in_stack_ffffffffffffff8c == 0xc) {
      Message::operator<<(in_stack_ffffffffffffff80,(char (*) [3])in_stack_ffffffffffffff78);
    }
    else if (in_stack_ffffffffffffff8c == 0xd) {
      Message::operator<<(in_stack_ffffffffffffff80,(char (*) [3])in_stack_ffffffffffffff78);
    }
    else if (((in_stack_ffffffffffffff8c == 0x22) || (in_stack_ffffffffffffff8c == 0x2f)) ||
            (in_stack_ffffffffffffff8c == 0x5c)) {
      in_stack_ffffffffffffff80 =
           Message::operator<<(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
      Message::operator<<(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    }
    else if (*pcVar2 < ' ') {
      in_stack_ffffffffffffff78 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Message::operator<<(in_stack_ffffffffffffff80,(char (*) [5])in_stack_ffffffffffffff78);
      String::FormatByte_abi_cxx11_(in_stack_0000015f);
      Message::operator<<(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      std::__cxx11::string::~string(local_58);
    }
    else {
      Message::operator<<(in_stack_ffffffffffffff80,(char *)in_stack_ffffffffffffff78);
    }
  }
  Message::GetString_abi_cxx11_
            ((Message *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  Message::~Message((Message *)0x14d159);
  return in_RDI;
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}